

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  ushort uVar1;
  ValueHolder VVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ArrayIndex index;
  ValueHolder *pVVar5;
  ValueHolder local_30;
  ushort local_28;
  ValueHolder local_18;
  ValueHolder VStack_10;
  
  Value((Value *)&local_30,value);
  index = size(this);
  pVVar5 = &operator[](this,index)->value_;
  uVar1 = *(ushort *)(pVVar5 + 1);
  *(ushort *)(pVVar5 + 1) = uVar1 & 0xff00 | local_28 & 0xff;
  VVar2 = *pVVar5;
  *pVVar5 = local_30;
  *(ushort *)(pVVar5 + 1) = uVar1 & 0xfe00 | local_28 & 0xff | local_28 & 0x100;
  local_28 = local_28 & 0xfe00 | uVar1 & 0xff | uVar1 & 0x100;
  VVar3 = pVVar5[3];
  VVar4 = pVVar5[4];
  pVVar5[3] = local_18;
  pVVar5[4] = VStack_10;
  local_30 = VVar2;
  local_18 = VVar3;
  VStack_10 = VVar4;
  ~Value((Value *)&local_30);
  return (Value *)pVVar5;
}

Assistant:

Value& Value::append(const Value& value) { return (*this)[size()] = value; }